

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polylinecurve.cpp
# Opt level: O3

bool __thiscall ON_PolylineCurve::Read(ON_PolylineCurve *this,ON_BinaryArchive *file)

{
  bool bVar1;
  int major_version;
  int minor_version;
  int local_18 [2];
  
  local_18[0] = 0;
  local_18[1] = 0;
  bVar1 = ON_BinaryArchive::Read3dmChunkVersion(file,local_18,local_18 + 1);
  if ((bVar1) && (local_18[0] == 1)) {
    bVar1 = ON_BinaryArchive::ReadArray(file,(ON_SimpleArray<ON_3dPoint> *)&this->m_pline);
    if ((bVar1) && (bVar1 = ON_BinaryArchive::ReadArray(file,&this->m_t), bVar1)) {
      bVar1 = ON_BinaryArchive::ReadInt(file,&this->m_dim);
      return bVar1;
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ON_PolylineCurve::Read( ON_BinaryArchive& file )
{
  int major_version = 0;
  int minor_version = 0;
  bool rc = file.Read3dmChunkVersion(&major_version,&minor_version);
  if (rc && major_version==1) {
    // common to all 1.x versions
    if (rc) rc = file.ReadArray( m_pline );
    if (rc) rc = file.ReadArray( m_t );
    if (rc) rc = file.ReadInt(&m_dim);
  }
  return rc;
}